

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space.h
# Opt level: O0

ProductUniformFEDofHandler * __thiscall
projects::dpg::ProductUniformFESpace<double>::LocGlobMap(ProductUniformFESpace<double> *this)

{
  bool bVar1;
  type pPVar2;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  stringstream local_418 [8];
  stringstream ss_1;
  ostream local_408 [383];
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  ProductUniformFESpace<double> *local_10;
  ProductUniformFESpace<double> *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->mesh_p_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"Invalid FE space, no mesh");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"mesh_p_ != nullptr",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_1f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1c8,&local_1f0,0x7f,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"false",&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_289);
    lf::base::AssertionFailed(&local_238,&local_260,0x7f,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    abort();
  }
  bVar1 = std::operator==(&this->dofh_p_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_418);
    std::operator<<(local_408,"Invalid FE space, no dofhandler");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"dofh_p_ != nullptr",&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_461);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_438,&local_460,0x80,&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"false",&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../product_fe_space.h"
               ,&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"",&local_4f9);
    lf::base::AssertionFailed(&local_4a8,&local_4d0,0x80,&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    abort();
  }
  pPVar2 = std::
           unique_ptr<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
           ::operator*(&this->dofh_p_);
  return pPVar2;
}

Assistant:

[[nodiscard]] const ProductUniformFEDofHandler &LocGlobMap() const {
    LF_ASSERT_MSG(mesh_p_ != nullptr, "Invalid FE space, no mesh");
    LF_ASSERT_MSG(dofh_p_ != nullptr, "Invalid FE space, no dofhandler");
    return *dofh_p_;
  }